

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O2

bool qt_is_ascii(char **ptr,char *end)

{
  undefined1 auVar1 [16];
  uint uVar2;
  byte bVar3;
  ushort uVar4;
  ulong uVar5;
  undefined1 (*pauVar6) [16];
  undefined1 (*pauVar7) [16];
  uint uVar8;
  bool bVar9;
  
  pauVar7 = (undefined1 (*) [16])*ptr;
  do {
    pauVar6 = pauVar7 + 1;
    if (end < pauVar6) {
      pauVar6 = (undefined1 (*) [16])(*pauVar7 + 8);
      if (end < pauVar6) goto LAB_0014ba83;
      uVar5 = *(ulong *)*pauVar7;
      bVar3 = (byte)(uVar5 >> 7) & 1 | ((byte)(uVar5 >> 0xf) & 1) << 1 |
              ((byte)(uVar5 >> 0x17) & 1) << 2 | ((byte)(uVar5 >> 0x1f) & 1) << 3 |
              ((byte)(uVar5 >> 0x27) & 1) << 4 | ((byte)(uVar5 >> 0x2f) & 1) << 5 |
              ((byte)(uVar5 >> 0x37) & 1) << 6 | (byte)(uVar5 >> 0x38) & 0x80;
      if (bVar3 == 0) {
        do {
          *ptr = (char *)pauVar6;
          pauVar7 = pauVar6;
LAB_0014ba83:
          pauVar6 = (undefined1 (*) [16])(*pauVar7 + 4);
          if (end < pauVar6) {
            while( true ) {
              bVar9 = pauVar7 == (undefined1 (*) [16])end;
              if (bVar9) {
                return bVar9;
              }
              if ((char)(*pauVar7)[0] < '\0') break;
              pauVar7 = (undefined1 (*) [16])(*pauVar7 + 1);
              *ptr = (char *)pauVar7;
            }
            return bVar9;
          }
          uVar8 = *(uint *)*pauVar7 & 0x80808080;
        } while (uVar8 == 0);
        uVar2 = 0;
        if (uVar8 != 0) {
          for (; (uVar8 >> uVar2 & 1) == 0; uVar2 = uVar2 + 1) {
          }
        }
        uVar5 = (ulong)(uVar2 >> 3);
      }
      else {
        uVar8 = 0;
        if (bVar3 != 0) {
          for (; (bVar3 >> uVar8 & 1) == 0; uVar8 = uVar8 + 1) {
          }
        }
        uVar5 = (ulong)uVar8;
      }
LAB_0014ba74:
      *ptr = *pauVar7 + uVar5;
      return false;
    }
    auVar1 = *pauVar7;
    uVar4 = (ushort)(SUB161(auVar1 >> 7,0) & 1) | (ushort)(SUB161(auVar1 >> 0xf,0) & 1) << 1 |
            (ushort)(SUB161(auVar1 >> 0x17,0) & 1) << 2 |
            (ushort)(SUB161(auVar1 >> 0x1f,0) & 1) << 3 |
            (ushort)(SUB161(auVar1 >> 0x27,0) & 1) << 4 |
            (ushort)(SUB161(auVar1 >> 0x2f,0) & 1) << 5 |
            (ushort)(SUB161(auVar1 >> 0x37,0) & 1) << 6 |
            (ushort)(SUB161(auVar1 >> 0x3f,0) & 1) << 7 |
            (ushort)(SUB161(auVar1 >> 0x47,0) & 1) << 8 |
            (ushort)(SUB161(auVar1 >> 0x4f,0) & 1) << 9 |
            (ushort)(SUB161(auVar1 >> 0x57,0) & 1) << 10 |
            (ushort)(SUB161(auVar1 >> 0x5f,0) & 1) << 0xb |
            (ushort)(SUB161(auVar1 >> 0x67,0) & 1) << 0xc |
            (ushort)(SUB161(auVar1 >> 0x6f,0) & 1) << 0xd |
            (ushort)(SUB161(auVar1 >> 0x77,0) & 1) << 0xe | (ushort)(byte)(auVar1[0xf] >> 7) << 0xf;
    if (uVar4 != 0) {
      uVar8 = 0;
      if (uVar4 != 0) {
        for (; (uVar4 >> uVar8 & 1) == 0; uVar8 = uVar8 + 1) {
        }
      }
      uVar5 = (ulong)uVar8;
      goto LAB_0014ba74;
    }
    *ptr = (char *)pauVar6;
    pauVar7 = pauVar6;
  } while( true );
}

Assistant:

bool qt_is_ascii(const char *&ptr, const char *end) noexcept
{
#if defined(__SSE2__)
    // Testing for the high bit can be done efficiently with just PMOVMSKB
    bool loops = true;
    if constexpr (UseAvx2) {
        while (ptr + 32 <= end) {
            __m256i data = _mm256_loadu_si256(reinterpret_cast<const __m256i *>(ptr));
            quint32 mask = _mm256_movemask_epi8(data);
            if (mask) {
                uint idx = qCountTrailingZeroBits(mask);
                ptr += idx;
                return false;
            }
            ptr += 32;
        }
        loops = false;
    }

    while (ptr + 16 <= end) {
        __m128i data = _mm_loadu_si128(reinterpret_cast<const __m128i *>(ptr));
        quint32 mask = _mm_movemask_epi8(data);
        if (mask) {
            uint idx = qCountTrailingZeroBits(mask);
            ptr += idx;
            return false;
        }
        ptr += 16;

        if (!loops)
            break;
    }
    if (ptr + 8 <= end) {
        __m128i data = _mm_loadl_epi64(reinterpret_cast<const __m128i *>(ptr));
        quint8 mask = _mm_movemask_epi8(data);
        if (mask) {
            uint idx = qCountTrailingZeroBits(mask);
            ptr += idx;
            return false;
        }
        ptr += 8;
    }
#endif

    while (ptr + 4 <= end) {
        quint32 data = qFromUnaligned<quint32>(ptr);
        if (data &= 0x80808080U) {
            uint idx = QSysInfo::ByteOrder == QSysInfo::BigEndian
                    ? qCountLeadingZeroBits(data)
                    : qCountTrailingZeroBits(data);
            ptr += idx / 8;
            return false;
        }
        ptr += 4;
    }

    while (ptr != end) {
        if (quint8(*ptr) & 0x80)
            return false;
        ++ptr;
    }
    return true;
}